

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

int Sim_UtilMatrsAreDisjoint(Sym_Man_t *p)

{
  int iVar1;
  long lVar2;
  
  if (0 < p->nOutputs) {
    lVar2 = 0;
    do {
      if ((p->vMatrSymms->nSize <= lVar2) || (p->vMatrNonSymms->nSize <= lVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = Extra_BitMatrixIsDisjoint
                        ((Extra_BitMat_t *)p->vMatrSymms->pArray[lVar2],
                         (Extra_BitMat_t *)p->vMatrNonSymms->pArray[lVar2]);
      if (iVar1 == 0) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->nOutputs);
  }
  return 1;
}

Assistant:

int Sim_UtilMatrsAreDisjoint( Sym_Man_t * p )
{
    int i;
    for ( i = 0; i < p->nOutputs; i++ )
        if ( !Extra_BitMatrixIsDisjoint( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,i), (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrNonSymms,i) ) )
            return 0;
    return 1;
}